

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O3

int bus0_pipe_init(void *arg,nni_pipe *np,void *s)

{
  *(nni_pipe **)arg = np;
  *(void **)((long)arg + 8) = s;
  *(undefined8 *)((long)arg + 0x58) = 0;
  *(undefined8 *)((long)arg + 0x60) = 0;
  nni_aio_init((nni_aio *)((long)arg + 0x238),bus0_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x70),bus0_pipe_recv_cb,arg);
  nni_lmq_init((nni_lmq *)((long)arg + 0x10),(long)*(int *)(*(long *)((long)arg + 8) + 0xc0));
  return 0;
}

Assistant:

static int
bus0_pipe_init(void *arg, nni_pipe *np, void *s)
{
	bus0_pipe *p = arg;

	p->pipe = np;
	p->bus  = s;
	NNI_LIST_NODE_INIT(&p->node);
	nni_aio_init(&p->aio_send, bus0_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, bus0_pipe_recv_cb, p);
	nni_lmq_init(&p->send_queue, p->bus->send_buf);

	return (0);
}